

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adsc_get_position.c
# Opt level: O2

void parse(char *txt)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  long lVar4;
  undefined8 *puVar5;
  uint uVar6;
  char *pcVar7;
  
  sVar2 = strlen(txt);
  iVar1 = la_acars_extract_sublabel_and_mfi("H1",2,txt,sVar2 & 0xffffffff,0,0);
  lVar3 = la_arinc_parse(txt + iVar1,2);
  puts(txt);
  if (lVar3 == 0) {
    puts("-- Failed to decode message");
    return;
  }
  lVar4 = la_proto_tree_find_adsc(lVar3);
  if (lVar4 == 0) {
    pcVar7 = "-- Not an ADS-C message";
  }
  else {
    pcVar7 = *(char **)(lVar4 + 8);
    if (*pcVar7 == '\x01') {
      puts("-- Malformed ADS-C message");
    }
    for (puVar5 = *(undefined8 **)(pcVar7 + 8); puVar5 != (undefined8 *)0x0;
        puVar5 = (undefined8 *)la_list_next(puVar5)) {
      uVar6 = (uint)*(byte *)*puVar5;
      if ((uVar6 < 0x15) && ((0x1c0680U >> (uVar6 & 0x1f) & 1) != 0)) {
        puVar5 = *(undefined8 **)((byte *)*puVar5 + 0x10);
        if (puVar5 != (undefined8 *)0x0) {
          printf(" Latitude: %f\n Longitude: %f\n Altitude: %d ft\n Timestamp: %f seconds past hour\n"
                 ,*puVar5,puVar5[1],puVar5[2],(ulong)*(uint *)(puVar5 + 3));
          goto LAB_001012e9;
        }
        break;
      }
    }
    pcVar7 = "-- Message does not contain an ADS-C Basic Report";
  }
  puts(pcVar7);
LAB_001012e9:
  la_proto_tree_destroy(lVar3);
  return;
}

Assistant:

void parse(char *txt) {
	// Skip sublabel and MFI if present, la_arinc_parse does not want them.
	int offset = la_acars_extract_sublabel_and_mfi("H1", LA_MSG_DIR_AIR2GND,
			txt, strlen(txt), NULL, NULL);
	// Parse the message and build the protocol tree
	la_proto_node *node = la_arinc_parse(txt + offset, LA_MSG_DIR_AIR2GND);
	printf("%s\n", txt);
	if(node == NULL) {
		printf("-- Failed to decode message\n");
		return;
	}
	// Walk the tree and find out if there is an ADS-C message in it.
	// If there is, adsc_node will point at its node in the tree.
	la_proto_node *adsc_node = la_proto_tree_find_adsc(node);
	if(adsc_node == NULL) {
		printf("-- Not an ADS-C message\n");
		goto cleanup;
	}
	la_adsc_msg_t *msg = (la_adsc_msg_t *)adsc_node->data;
	// Print a warning if the decoder has raised an error flag.
	// The flag means that the message decoding has failed, at least partially.
	// For example, it might have been an uplink message (while we expect
	// a downlink) or it might have been truncated (decoded partially).
	// We don't fail here, hoping for the second case - if basic report tag
	// has been decoded correctly, we might get a good position.
	if(msg->err == true) {
		printf("-- Malformed ADS-C message\n");
	}
	la_list *l = msg->tag_list;
	la_adsc_basic_report_t *rpt = NULL;
	// We have a good ADS-C message.
	// Now walk the list of tags and find out if it contains a Basic Report tag
	// (this is where coordinates are found).
	while(l != NULL) {
		la_adsc_tag_t *tag_struct = (la_adsc_tag_t *)l->data;
		uint8_t t = tag_struct->tag;
		// These tags contain a Basic Report
		if(t == 7 || t == 9 || t == 10 || t == 18 || t == 19 || t == 20) {
			rpt = (la_adsc_basic_report_t *)tag_struct->data;
			break;
		}
		l = la_list_next(l);
	}
	if(rpt == NULL) {
		printf("-- Message does not contain an ADS-C Basic Report\n");
		goto cleanup;
	}
	// We have found a Basic Report - print some fields from it.
	printf(" Latitude: %f\n Longitude: %f\n Altitude: %d ft\n Timestamp: %f seconds past hour\n",
			rpt->lat, rpt->lon, rpt->alt, rpt->timestamp);
cleanup:
	la_proto_tree_destroy(node);
}